

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Relooper.h
# Opt level: O0

void __thiscall CFG::LoopShape::LoopShape(LoopShape *this)

{
  LoopShape *this_local;
  
  Shape::Shape(&this->super_Shape,Loop);
  (this->super_Shape)._vptr_Shape = (_func_int **)&PTR__LoopShape_0271cad8;
  this->Inner = (Shape *)0x0;
  ::wasm::InsertOrderedSet<CFG::Block_*>::InsertOrderedSet(&this->Entries);
  return;
}

Assistant:

LoopShape() : Shape(Loop) {}